

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResultCollector.cpp
# Opt level: O1

void __thiscall CppUnit::TestResultCollector::freeFailures(TestResultCollector *this)

{
  _Elt_pointer ppTVar1;
  _Elt_pointer ppTVar2;
  _Map_pointer pppTVar3;
  _Elt_pointer ppTVar4;
  
  ppTVar1 = (this->m_failures).
            super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  if (ppTVar1 !=
      (this->m_failures).
      super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur) {
    ppTVar4 = (this->m_failures).
              super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last;
    pppTVar3 = (this->m_failures).
               super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      ppTVar2 = ppTVar1 + 1;
      if (ppTVar2 == ppTVar4) {
        ppTVar2 = pppTVar3[1];
        pppTVar3 = pppTVar3 + 1;
        ppTVar4 = ppTVar2 + 0x40;
      }
      if (*ppTVar1 != (TestFailure *)0x0) {
        (*(*ppTVar1)->_vptr_TestFailure[1])();
      }
      ppTVar1 = ppTVar2;
    } while (ppTVar2 !=
             (this->m_failures).
             super__Deque_base<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  std::deque<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>::clear
            (&this->m_failures);
  return;
}

Assistant:

void 
TestResultCollector::freeFailures()
{
  TestFailures::iterator itFailure = m_failures.begin();
  while ( itFailure != m_failures.end() )
    delete *itFailure++;
  m_failures.clear();
}